

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffcpky(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,char *rootname,int *status)

{
  int iVar1;
  int *in_R9;
  char card [81];
  char comment [73];
  char value [71];
  char keyname [75];
  int tstatus;
  int *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  fitsfile *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  ffkeyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
         in_stack_fffffffffffffeb0);
  iVar1 = ffgkey(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (iVar1 < 1) {
    ffkeyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
           in_stack_fffffffffffffeb0);
    ffmkky(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
           in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    ffprec(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
           &in_stack_fffffffffffffef8->HDUposition);
  }
  return *in_R9;
}

Assistant:

int ffcpky(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - input index number   */
           int outcol,          /* I - output index number  */
           char *rootname,      /* I - root name of the keyword to be copied */
           int *status)         /* IO - error status     */
/*
  copy an indexed keyword from infptr to outfptr.
*/
{
    int tstatus = 0;
    char keyname[FLEN_KEYWORD];
    char value[FLEN_VALUE], comment[FLEN_COMMENT], card[FLEN_CARD];

    ffkeyn(rootname, incol, keyname, &tstatus);
    if (ffgkey(infptr, keyname, value, comment, &tstatus) <= 0)
    {
        ffkeyn(rootname, outcol, keyname, &tstatus);
        ffmkky(keyname, value, comment, card, status);
        ffprec(outfptr, card, status);
    }
    return(*status);
}